

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_o1.cc
# Opt level: O3

MatrixXd * __thiscall
lf::geometry::QuadO1::Global(MatrixXd *__return_storage_ptr__,QuadO1 *this,MatrixXd *local)

{
  pointer pcVar1;
  PointerType pdVar2;
  Index IVar3;
  MatrixXd *pMVar4;
  PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *pPVar5;
  long lVar6;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>
  *pCVar7;
  RhsNested *pRVar8;
  byte bVar9;
  stringstream ss;
  scalar_sum_op<double,_double> local_12e1;
  MatrixXd *local_12e0;
  Matrix<double,__1,_4,_0,__1,_4> *local_12d8;
  PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *local_12d0;
  ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_12c8;
  ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_12c0;
  ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_12b8;
  ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_12b0;
  ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_12a8;
  ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_12a0;
  ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_1298;
  ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_1290;
  undefined1 local_1288 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1278;
  variable_if_dynamic<long,__1> local_1268;
  variable_if_dynamic<long,__1> vStack_1260;
  Index local_1258;
  variable_if_dynamic<long,__1> local_1238;
  scalar_constant_op<double> local_1230;
  PointerType local_1228;
  undefined8 uStack_1220;
  variable_if_dynamic<long,__1> local_1218;
  XprTypeNested XStack_1210;
  variable_if_dynamic<long,__1> local_1208;
  variable_if_dynamic<long,__1> vStack_1200;
  Index local_11f8;
  variable_if_dynamic<long,__1> local_11d8;
  scalar_constant_op<double> local_11d0;
  PointerType local_11c8;
  undefined8 uStack_11c0;
  variable_if_dynamic<long,__1> local_11b8;
  XprTypeNested XStack_11b0;
  variable_if_dynamic<long,__1> local_11a8;
  variable_if_dynamic<long,__1> vStack_11a0;
  Index local_1198;
  Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>
  local_1178;
  undefined1 local_1140 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1130 [29];
  undefined1 local_f58 [680];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>
  local_cb0;
  Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>
  local_c50;
  Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>
  local_c18;
  MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> local_be0;
  Matrix<double,__1,_4,_0,__1,_4> *pMStack_bc8;
  long local_bc0;
  long lStack_bb8;
  Index local_bb0;
  Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>
  local_ba8;
  Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>
  local_b70;
  MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> local_b38;
  Matrix<double,__1,_4,_0,__1,_4> *pMStack_b20;
  long local_b18;
  long lStack_b10;
  Index local_b08;
  Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>
  local_b00;
  MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> local_ac8;
  Matrix<double,__1,_4,_0,__1,_4> *pMStack_ab0;
  long local_aa8;
  long lStack_aa0;
  Index local_a98;
  Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>
  local_a90;
  Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>
  local_a58;
  MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> local_a20;
  Matrix<double,__1,_4,_0,__1,_4> *pMStack_a08;
  long local_a00;
  long lStack_9f8;
  Index local_9f0;
  undefined1 local_9e8 [920];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>
  local_650;
  Rhs local_5a8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>
  local_4f8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>
  local_498;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>
  local_438;
  Rhs local_3d8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>
  local_2f0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>_>
  local_278;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>_>
  local_1d8;
  Rhs local_108;
  
  bVar9 = 0;
  local_12d0 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__;
  if ((local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows ==
      2) {
    local_12d8 = &this->coords_;
    Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::
    MapBase(&local_a20,
            (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.m_storage
            .m_data,(this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
                    m_storage.m_rows,1);
    local_a00 = 0;
    lStack_9f8 = 0;
    local_9f0 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
                m_storage.m_rows;
    local_1290.m_expression = local;
    pMStack_a08 = &this->coords_;
    Eigen::
    Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>
    ::Block(&local_a58,&local_1290,0);
    local_f58._0_8_ = &DAT_3ff0000000000000;
    local_12e0 = local;
    Eigen::
    CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
    ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                      *)local_9e8,1,
                     local_a58.
                     super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
                     .
                     super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
                     .m_cols.m_value,(scalar_constant_op<double> *)local_f58);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>_>
    ::CwiseBinaryOp(&local_cb0,
                    (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                     *)local_9e8,&local_a58,(scalar_difference_op<double,_double> *)local_1140);
    local_1298.m_expression = local;
    Eigen::
    Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>
    ::Block(&local_a90,&local_1298,1);
    local_f58._0_8_ = &DAT_3ff0000000000000;
    Eigen::
    CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
    ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                      *)local_9e8,1,
                     local_a90.
                     super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
                     .
                     super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
                     .m_cols.m_value,(scalar_constant_op<double> *)local_f58);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>_>
    ::CwiseBinaryOp(&local_438,
                    (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                     *)local_9e8,&local_a90,(scalar_difference_op<double,_double> *)local_1140);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>_>_>
    ::CwiseBinaryOp(&local_1d8,&local_cb0,&local_438,(scalar_product_op<double,_double> *)local_9e8)
    ;
    local_1228 = local_1d8.m_lhs.m_rhs.
                 super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
                 .m_data;
    uStack_1220 = local_1d8.m_lhs.m_rhs.
                  super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
                  .
                  super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
                  ._8_8_;
    local_1218.m_value =
         local_1d8.m_lhs.m_rhs.
         super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
         .
         super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
         .m_cols.m_value;
    XStack_1210.m_expression =
         local_1d8.m_lhs.m_rhs.
         super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
         .m_xpr.m_expression;
    local_1208.m_value =
         local_1d8.m_lhs.m_rhs.
         super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
         .m_startRow.m_value;
    vStack_1200.m_value =
         local_1d8.m_lhs.m_rhs.
         super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
         .m_startCol.m_value;
    local_11f8 = local_1d8.m_lhs.m_rhs.
                 super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
                 .m_outerStride;
    local_11c8 = local_1d8.m_rhs.m_rhs.
                 super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
                 .m_data;
    uStack_11c0 = local_1d8.m_rhs.m_rhs.
                  super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
                  .
                  super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
                  ._8_8_;
    local_11b8.m_value =
         local_1d8.m_rhs.m_rhs.
         super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
         .
         super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
         .m_cols.m_value;
    XStack_11b0.m_expression =
         local_1d8.m_rhs.m_rhs.
         super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
         .m_xpr.m_expression;
    local_11a8.m_value =
         local_1d8.m_rhs.m_rhs.
         super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
         .m_startRow.m_value;
    vStack_11a0.m_value =
         local_1d8.m_rhs.m_rhs.
         super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
         .m_startCol.m_value;
    local_1198 = local_1d8.m_rhs.m_rhs.
                 super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
                 .m_outerStride;
    local_1258 = local_9f0;
    local_1268.m_value = local_a00;
    vStack_1260.m_value = lStack_9f8;
    local_1278._M_allocated_capacity = local_a20._16_8_;
    local_1278._8_8_ = pMStack_a08;
    local_1288._0_8_ = local_a20.m_data;
    local_1288._8_8_ = local_a20.m_rows.m_value;
    local_1238.m_value = local_1d8.m_lhs.m_lhs.m_cols.m_value;
    local_1230.m_other = local_1d8.m_lhs.m_lhs.m_functor.m_other;
    local_11d8.m_value = local_1d8.m_rhs.m_lhs.m_cols.m_value;
    local_11d0.m_other = local_1d8.m_rhs.m_lhs.m_functor.m_other;
    IVar3 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.m_storage
            .m_rows;
    Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::
    MapBase(&local_ac8,
            (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.m_storage
            .m_data + IVar3,IVar3,1);
    pMVar4 = local_12e0;
    pMStack_ab0 = local_12d8;
    local_aa8 = 0;
    lStack_aa0 = 1;
    local_a98 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
                m_storage.m_rows;
    local_12a0.m_expression = local_12e0;
    Eigen::
    Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>
    ::Block(&local_1178,&local_12a0,0);
    local_12a8.m_expression = pMVar4;
    Eigen::
    Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>
    ::Block(&local_b00,&local_12a8,1);
    local_f58._0_8_ = &DAT_3ff0000000000000;
    Eigen::
    CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
    ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                      *)local_9e8,1,
                     local_b00.
                     super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
                     .
                     super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
                     .m_cols.m_value,(scalar_constant_op<double> *)local_f58);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>_>
    ::CwiseBinaryOp(&local_498,
                    (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                     *)local_9e8,&local_b00,(scalar_difference_op<double,_double> *)local_1140);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>_>_>
    ::CwiseBinaryOp(&local_278,&local_1178,&local_498,(scalar_product_op<double,_double> *)local_9e8
                   );
    local_108.m_rhs.m_expression.m_rhs.m_rhs.
    super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
    .m_data = local_278.m_rhs.m_rhs.
              super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
              .
              super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
              .m_data;
    local_108.m_rhs.m_expression.m_rhs.m_rhs.
    super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
    ._8_8_ = local_278.m_rhs.m_rhs.
             super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
             .
             super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
             ._8_8_;
    local_108.m_rhs.m_expression.m_rhs.m_rhs.
    super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
    .m_cols.m_value =
         local_278.m_rhs.m_rhs.
         super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
         .
         super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
         .m_cols.m_value;
    local_108.m_rhs.m_expression.m_rhs.m_rhs.
    super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
    .m_xpr.m_expression =
         local_278.m_rhs.m_rhs.
         super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
         .m_xpr.m_expression;
    local_108.m_rhs.m_expression.m_rhs.m_rhs.
    super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
    .m_startRow.m_value =
         local_278.m_rhs.m_rhs.
         super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
         .m_startRow.m_value;
    local_108.m_rhs.m_expression.m_rhs.m_rhs.
    super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
    .m_startCol.m_value =
         local_278.m_rhs.m_rhs.
         super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
         .m_startCol.m_value;
    local_108.m_rhs.m_expression.m_rhs.m_rhs.
    super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
    .m_outerStride =
         local_278.m_rhs.m_rhs.
         super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
         .m_outerStride;
    local_108.m_lhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0>.m_data
         = local_ac8.m_data;
    local_108.m_lhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0>.m_rows
    .m_value = local_ac8.m_rows.m_value;
    local_108.m_lhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0>._16_8_
         = local_ac8._16_8_;
    local_108.m_lhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_xpr =
         pMStack_ab0;
    local_108.m_lhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
    m_startRow.m_value = local_aa8;
    local_108.m_lhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
    m_startCol.m_value = lStack_aa0;
    local_108.m_lhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
    m_outerStride = local_a98;
    local_108.m_rhs.m_expression.m_lhs.
    super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
    .m_outerStride =
         local_278.m_lhs.
         super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
         .m_outerStride;
    local_108.m_rhs.m_expression.m_lhs.
    super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
    .m_startRow.m_value =
         local_278.m_lhs.
         super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
         .m_startRow.m_value;
    local_108.m_rhs.m_expression.m_lhs.
    super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
    .m_startCol.m_value =
         local_278.m_lhs.
         super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
         .m_startCol.m_value;
    local_108.m_rhs.m_expression.m_lhs.
    super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
    .m_cols.m_value =
         local_278.m_lhs.
         super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
         .
         super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
         .m_cols.m_value;
    local_108.m_rhs.m_expression.m_lhs.
    super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
    .m_xpr.m_expression =
         local_278.m_lhs.
         super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
         .m_xpr.m_expression;
    local_108.m_rhs.m_expression.m_lhs.
    super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
    .m_data = local_278.m_lhs.
              super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
              .
              super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
              .m_data;
    local_108.m_rhs.m_expression.m_lhs.
    super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
    ._8_8_ = local_278.m_lhs.
             super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
             .
             super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
             ._8_8_;
    local_108.m_rhs.m_expression.m_rhs.m_lhs.m_cols.m_value = local_278.m_rhs.m_lhs.m_cols.m_value;
    local_108.m_rhs.m_expression.m_rhs.m_lhs.m_functor.m_other =
         local_278.m_rhs.m_lhs.m_functor.m_other;
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>_>_>_>,_0>,_const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>_>_>_>,_0>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>_>_>,_0>,_const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>_>_>,_0>_>
                     *)local_1140,(Lhs *)local_1288,&local_108,
                    (scalar_sum_op<double,_double> *)local_9e8);
    IVar3 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.m_storage
            .m_rows;
    Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::
    MapBase(&local_b38,
            (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.m_storage
            .m_data + IVar3 * 2,IVar3,1);
    pMVar4 = local_12e0;
    pMStack_b20 = local_12d8;
    local_b18 = 0;
    lStack_b10 = 2;
    local_b08 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
                m_storage.m_rows;
    local_12b0.m_expression = local_12e0;
    Eigen::
    Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>
    ::Block(&local_b70,&local_12b0,0);
    local_12b8.m_expression = pMVar4;
    Eigen::
    Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>
    ::Block(&local_ba8,&local_12b8,1);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>_>
    ::CwiseBinaryOp(&local_2f0,&local_b70,&local_ba8,(scalar_product_op<double,_double> *)local_9e8)
    ;
    local_5a8.m_lhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0>.m_data
         = local_b38.m_data;
    local_5a8.m_lhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0>.m_rows
    .m_value = local_b38.m_rows.m_value;
    local_5a8.m_lhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0>._16_8_
         = local_b38._16_8_;
    local_5a8.m_lhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_xpr =
         pMStack_b20;
    local_5a8.m_lhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
    m_startRow.m_value = local_b18;
    local_5a8.m_lhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
    m_startCol.m_value = lStack_b10;
    local_5a8.m_lhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
    m_outerStride = local_b08;
    pCVar7 = &local_2f0;
    pRVar8 = &local_5a8.m_rhs;
    for (lVar6 = 0xe; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pRVar8->m_expression).m_lhs.
      super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
      .
      super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
      .m_data = (pCVar7->m_lhs).
                super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
                .
                super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
                .
                super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
                .m_data;
      pCVar7 = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>
                *)((long)pCVar7 + (ulong)bVar9 * -0x10 + 8);
      pRVar8 = (RhsNested *)((long)pRVar8 + ((ulong)bVar9 * -2 + 1) * 8);
    }
    Eigen::CwiseBinaryOp<$8380bdf0$>::CwiseBinaryOp
              ((CwiseBinaryOp<_8380bdf0_> *)local_f58,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>_>_>,_0>,_const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>_>_>_>,_0>_>
                *)local_1140,&local_5a8,(scalar_sum_op<double,_double> *)local_9e8);
    IVar3 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.m_storage
            .m_rows;
    Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::
    MapBase(&local_be0,
            (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.m_storage
            .m_data + IVar3 * 3,IVar3,1);
    pMVar4 = local_12e0;
    pMStack_bc8 = local_12d8;
    local_bc0 = 0;
    lStack_bb8 = 3;
    local_bb0 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
                m_storage.m_rows;
    local_12c0.m_expression = local_12e0;
    Eigen::
    Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>
    ::Block(&local_c18,&local_12c0,0);
    local_3d8.m_lhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0>.m_data
         = (PointerType)0x3ff0000000000000;
    Eigen::
    CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
    ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                      *)local_9e8,1,
                     local_c18.
                     super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
                     .
                     super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
                     .m_cols.m_value,(scalar_constant_op<double> *)&local_3d8);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>_>
    ::CwiseBinaryOp(&local_4f8,
                    (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                     *)local_9e8,&local_c18,(scalar_difference_op<double,_double> *)&local_650);
    local_12c8.m_expression = pMVar4;
    Eigen::
    Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>
    ::Block(&local_c50,&local_12c8,1);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>_>,_const_Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1,_-1,_false>_>
    ::CwiseBinaryOp(&local_650,&local_4f8,&local_c50,(scalar_product_op<double,_double> *)local_9e8)
    ;
    local_3d8.m_rhs.m_expression.m_lhs.m_rhs.
    super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
    .m_data = local_650.m_lhs.m_rhs.
              super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
              .
              super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
              .m_data;
    local_3d8.m_rhs.m_expression.m_lhs.m_rhs.
    super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
    ._8_8_ = local_650.m_lhs.m_rhs.
             super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
             .
             super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
             ._8_8_;
    local_3d8.m_rhs.m_expression.m_lhs.m_rhs.
    super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
    .m_cols.m_value =
         local_650.m_lhs.m_rhs.
         super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
         .
         super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
         .m_cols.m_value;
    local_3d8.m_rhs.m_expression.m_lhs.m_rhs.
    super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
    .m_xpr.m_expression =
         local_650.m_lhs.m_rhs.
         super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
         .m_xpr.m_expression;
    local_3d8.m_rhs.m_expression.m_lhs.m_rhs.
    super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
    .m_startRow.m_value =
         local_650.m_lhs.m_rhs.
         super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
         .m_startRow.m_value;
    local_3d8.m_rhs.m_expression.m_lhs.m_rhs.
    super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
    .m_startCol.m_value =
         local_650.m_lhs.m_rhs.
         super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
         .m_startCol.m_value;
    local_3d8.m_rhs.m_expression.m_lhs.m_rhs.
    super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
    .m_outerStride =
         local_650.m_lhs.m_rhs.
         super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
         .m_outerStride;
    local_3d8.m_lhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0>.m_data
         = local_be0.m_data;
    local_3d8.m_lhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0>.m_rows
    .m_value = local_be0.m_rows.m_value;
    local_3d8.m_lhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0>._16_8_
         = local_be0._16_8_;
    local_3d8.m_lhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_xpr =
         pMStack_bc8;
    local_3d8.m_lhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
    m_startRow.m_value = local_bc0;
    local_3d8.m_lhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
    m_startCol.m_value = lStack_bb8;
    local_3d8.m_lhs.
    super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
    m_outerStride = local_bb0;
    local_3d8.m_rhs.m_expression.m_lhs.m_lhs.m_cols.m_value = local_650.m_lhs.m_lhs.m_cols.m_value;
    local_3d8.m_rhs.m_expression.m_lhs.m_lhs.m_functor.m_other =
         local_650.m_lhs.m_lhs.m_functor.m_other;
    local_3d8.m_rhs.m_expression.m_rhs.
    super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
    .m_data = local_650.m_rhs.
              super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
              .
              super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
              .m_data;
    local_3d8.m_rhs.m_expression.m_rhs.
    super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
    ._8_8_ = local_650.m_rhs.
             super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
             .
             super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
             ._8_8_;
    local_3d8.m_rhs.m_expression.m_rhs.
    super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
    .m_cols.m_value =
         local_650.m_rhs.
         super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
         .
         super_MapBase<Eigen::Block<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false>,_0>
         .m_cols.m_value;
    local_3d8.m_rhs.m_expression.m_rhs.
    super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
    .m_xpr.m_expression =
         local_650.m_rhs.
         super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
         .m_xpr.m_expression;
    local_3d8.m_rhs.m_expression.m_rhs.
    super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
    .m_startRow.m_value =
         local_650.m_rhs.
         super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
         .m_startRow.m_value;
    local_3d8.m_rhs.m_expression.m_rhs.
    super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
    .m_startCol.m_value =
         local_650.m_rhs.
         super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
         .m_startCol.m_value;
    local_3d8.m_rhs.m_expression.m_rhs.
    super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
    .m_outerStride =
         local_650.m_rhs.
         super_BlockImpl<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1,__1,_false,_true>
         .m_outerStride;
    Eigen::CwiseBinaryOp<$b99b4b1d$>::CwiseBinaryOp
              ((CwiseBinaryOp<_b99b4b1d_> *)local_9e8,(Lhs *)local_f58,&local_3d8,&local_12e1);
    pPVar5 = local_12d0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::Block<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,1,_1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::Block<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,1,_1,false>const>const>const>,0>const,Eigen::Product<Eigen::Bl___Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,1,_1,false>const>const>,0>const>>
              (local_12d0,(DenseBase<_ec7428b8_> *)local_9e8);
    return (MatrixXd *)pPVar5;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_9e8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_9e8 + 0x10),"reference coords must be 2-vectors",0x22);
  pcVar1 = local_f58 + 0x10;
  local_f58._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f58,"local.rows() == 2","");
  pdVar2 = (PointerType)(local_1140 + 0x10);
  local_1140._0_8_ = pdVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1140,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed((string *)local_f58,(string *)local_1140,0x44,(string *)local_1288);
  if ((undefined1 *)local_1288._0_8_ != local_1288 + 0x10) {
    operator_delete((void *)local_1288._0_8_,local_1278._M_allocated_capacity + 1);
  }
  if ((PointerType)local_1140._0_8_ != pdVar2) {
    operator_delete((void *)local_1140._0_8_,local_1130[0]._M_allocated_capacity + 1);
  }
  if ((pointer)local_f58._0_8_ != pcVar1) {
    operator_delete((void *)local_f58._0_8_,local_f58._16_8_ + 1);
  }
  local_f58._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f58,"false","");
  local_1140._0_8_ = pdVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1140,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
             ,"");
  local_1288._0_8_ = local_1288 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1288,"");
  base::AssertionFailed((string *)local_f58,(string *)local_1140,0x44,(string *)local_1288);
  std::__cxx11::string::~string((string *)local_1288);
  std::__cxx11::string::~string((string *)local_1140);
  std::__cxx11::string::~string((string *)local_f58);
  abort();
}

Assistant:

Eigen::MatrixXd QuadO1::Global(const Eigen::MatrixXd& local) const {
  LF_ASSERT_MSG(local.rows() == 2, "reference coords must be 2-vectors");
  // Componentwise bilinear transformation from unit square in a
  // vectorized fashion.
  // Note the use of array and matrix views offered by Eigen.
  return coords_.col(0) *
             ((1 - local.array().row(0)) * (1 - local.array().row(1)))
                 .matrix() +
         coords_.col(1) *
             (local.array().row(0) * (1 - local.array().row(1))).matrix() +
         coords_.col(2) *
             (local.array().row(0) * local.array().row(1)).matrix() +
         coords_.col(3) *
             ((1 - local.array().row(0)) * local.array().row(1)).matrix();
}